

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tmpdir.c
# Opt level: O3

int run_test_tmpdir(void)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint extraout_EAX;
  size_t sVar4;
  undefined1 *puVar5;
  undefined8 uVar6;
  undefined1 *puVar7;
  char *unaff_RBX;
  int *piVar8;
  size_t len;
  char tmpdir [1024];
  uint uStack_1398;
  uint uStack_1394;
  undefined1 auStack_1390 [8];
  undefined1 auStack_1388 [90];
  byte bStack_132e;
  undefined1 auStack_1250 [90];
  byte bStack_11f6;
  undefined1 auStack_1118 [848];
  undefined1 *puStack_dc8;
  code *pcStack_dc0;
  undefined1 auStack_db0 [312];
  undefined1 auStack_c78 [312];
  undefined1 auStack_b40 [312];
  undefined1 auStack_a08 [848];
  code *pcStack_6b8;
  uint uStack_6a8;
  uint uStack_6a4;
  undefined1 auStack_6a0 [312];
  undefined1 auStack_568 [312];
  char *pcStack_430;
  undefined8 local_410;
  char local_408 [1024];
  
  local_410 = 0x400;
  local_408[0] = '\0';
  iVar1 = uv_os_tmpdir();
  if (iVar1 == 0) {
    unaff_RBX = local_408;
    sVar4 = strlen(unaff_RBX);
    if (sVar4 != local_410) goto LAB_00177dba;
    if (sVar4 == 0) goto LAB_00177dbf;
    if (local_408[sVar4] != '\0') goto LAB_00177dc4;
    if ((sVar4 == 1) || (unaff_RBX[sVar4 - 1] != '/')) {
      local_410 = 1;
      iVar1 = uv_os_tmpdir(local_408);
      if (iVar1 != -0x69) goto LAB_00177dc9;
      if (local_410 < 2) goto LAB_00177dce;
      iVar1 = uv_os_tmpdir(0);
      if (iVar1 != -0x16) goto LAB_00177dd3;
      iVar1 = uv_os_tmpdir(local_408);
      if (iVar1 != -0x16) goto LAB_00177dd8;
      local_410 = 0;
      iVar1 = uv_os_tmpdir(local_408);
      if (iVar1 == -0x16) {
        return 0;
      }
      goto LAB_00177ddd;
    }
  }
  else {
    run_test_tmpdir_cold_1();
LAB_00177dba:
    run_test_tmpdir_cold_2();
LAB_00177dbf:
    run_test_tmpdir_cold_10();
LAB_00177dc4:
    run_test_tmpdir_cold_3();
LAB_00177dc9:
    run_test_tmpdir_cold_5();
LAB_00177dce:
    run_test_tmpdir_cold_6();
LAB_00177dd3:
    run_test_tmpdir_cold_7();
LAB_00177dd8:
    run_test_tmpdir_cold_8();
LAB_00177ddd:
    run_test_tmpdir_cold_9();
  }
  run_test_tmpdir_cold_4();
  pcStack_6b8 = (code *)0x177df8;
  pcStack_430 = unaff_RBX;
  puVar5 = (undefined1 *)uv_default_loop();
  pcStack_6b8 = (code *)0x177e0d;
  uVar2 = open64("/dev/tty",0,0);
  if (-1 < (int)uVar2) {
    piVar8 = (int *)(ulong)uVar2;
    pcStack_6b8 = (code *)0x177e2d;
    iVar1 = open64("/dev/tty",1,0);
    if (-1 < iVar1) {
      pcStack_6b8 = (code *)0x177e41;
      iVar3 = uv_guess_handle(0xffffffff);
      if (iVar3 == 0) {
        pcStack_6b8 = (code *)0x177e51;
        iVar3 = uv_guess_handle(piVar8);
        if (iVar3 != 0xe) goto LAB_0017808d;
        pcStack_6b8 = (code *)0x177e61;
        iVar3 = uv_guess_handle(iVar1);
        if (iVar3 != 0xe) goto LAB_00178092;
        pcStack_6b8 = (code *)0x177e6f;
        uVar6 = uv_default_loop();
        pcStack_6b8 = (code *)0x177e84;
        iVar3 = uv_tty_init(uVar6,auStack_6a0,uVar2,1);
        if (iVar3 != 0) goto LAB_00178097;
        pcStack_6b8 = (code *)0x177e96;
        iVar3 = uv_is_readable(auStack_6a0);
        if (iVar3 == 0) goto LAB_0017809c;
        pcStack_6b8 = (code *)0x177ea8;
        iVar3 = uv_is_writable(auStack_6a0);
        if (iVar3 != 0) goto LAB_001780a1;
        pcStack_6b8 = (code *)0x177eb5;
        uVar6 = uv_default_loop();
        pcStack_6b8 = (code *)0x177ec9;
        iVar1 = uv_tty_init(uVar6,auStack_568,iVar1,0);
        if (iVar1 != 0) goto LAB_001780a6;
        pcStack_6b8 = (code *)0x177ede;
        iVar1 = uv_is_readable(auStack_568);
        if (iVar1 != 0) goto LAB_001780ab;
        pcStack_6b8 = (code *)0x177ef3;
        iVar1 = uv_is_writable(auStack_568);
        if (iVar1 == 0) goto LAB_001780b0;
        pcStack_6b8 = (code *)0x177f12;
        iVar1 = uv_tty_get_winsize(auStack_568,&uStack_6a4,&uStack_6a8);
        if (iVar1 != 0) goto LAB_001780b5;
        pcStack_6b8 = (code *)0x177f30;
        printf("width=%d height=%d\n",(ulong)uStack_6a4,(ulong)uStack_6a8);
        if (uStack_6a4 == 0 && uStack_6a8 == 0) {
          pcStack_6b8 = (code *)0x177f43;
          puVar5 = (undefined1 *)uv_default_loop();
          pcStack_6b8 = (code *)0x177f57;
          uv_walk(puVar5,close_walk_cb,0);
          pcStack_6b8 = (code *)0x177f61;
          uv_run(puVar5);
          pcStack_6b8 = (code *)0x177f66;
          uVar6 = uv_default_loop();
          pcStack_6b8 = (code *)0x177f6e;
          iVar1 = uv_loop_close(uVar6);
          piVar8 = (int *)0x1;
          if (iVar1 == 0) goto LAB_00178079;
          pcStack_6b8 = (code *)0x177f81;
          run_test_tty_cold_18();
          uStack_6a8 = extraout_EAX;
        }
        if ((int)uStack_6a4 < 0xb) goto LAB_001780ba;
        if ((int)uStack_6a8 < 0xb) goto LAB_001780bf;
        pcStack_6b8 = (code *)0x177fa2;
        iVar1 = uv_tty_set_mode(auStack_6a0);
        if (iVar1 != 0) goto LAB_001780c4;
        pcStack_6b8 = (code *)0x177fb6;
        iVar1 = uv_tty_set_mode(auStack_6a0);
        if (iVar1 != 0) goto LAB_001780c9;
        pcStack_6b8 = (code *)0x177fc3;
        piVar8 = __errno_location();
        *piVar8 = 0;
        pcStack_6b8 = (code *)0x177fd1;
        iVar1 = uv_tty_reset_mode();
        if (iVar1 != 0) goto LAB_001780ce;
        pcStack_6b8 = (code *)0x177fde;
        iVar1 = uv_tty_reset_mode();
        if (iVar1 != 0) goto LAB_001780d3;
        pcStack_6b8 = (code *)0x177feb;
        iVar1 = uv_tty_reset_mode();
        if (iVar1 != 0) goto LAB_001780d8;
        if (*piVar8 == 0) {
          piVar8 = (int *)0x0;
          pcStack_6b8 = (code *)0x17800c;
          uv_close(auStack_6a0,0);
          pcStack_6b8 = (code *)0x17801b;
          uv_close(auStack_568,0);
          pcStack_6b8 = (code *)0x178025;
          uv_run(puVar5,0);
          pcStack_6b8 = (code *)0x17802a;
          uVar6 = uv_default_loop();
          pcStack_6b8 = (code *)0x17803e;
          uv_walk(uVar6,close_walk_cb,0);
          pcStack_6b8 = (code *)0x178048;
          uv_run(uVar6,0);
          pcStack_6b8 = (code *)0x17804d;
          uVar6 = uv_default_loop();
          pcStack_6b8 = (code *)0x178055;
          iVar1 = uv_loop_close(uVar6);
          if (iVar1 == 0) goto LAB_00178079;
          pcStack_6b8 = (code *)0x17805e;
          run_test_tty_cold_17();
          goto LAB_0017806e;
        }
      }
      else {
        pcStack_6b8 = (code *)0x17808d;
        run_test_tty_cold_1();
LAB_0017808d:
        pcStack_6b8 = (code *)0x178092;
        run_test_tty_cold_2();
LAB_00178092:
        pcStack_6b8 = (code *)0x178097;
        run_test_tty_cold_3();
LAB_00178097:
        pcStack_6b8 = (code *)0x17809c;
        run_test_tty_cold_4();
LAB_0017809c:
        pcStack_6b8 = (code *)0x1780a1;
        run_test_tty_cold_20();
LAB_001780a1:
        pcStack_6b8 = (code *)0x1780a6;
        run_test_tty_cold_5();
LAB_001780a6:
        pcStack_6b8 = (code *)0x1780ab;
        run_test_tty_cold_6();
LAB_001780ab:
        pcStack_6b8 = (code *)0x1780b0;
        run_test_tty_cold_7();
LAB_001780b0:
        pcStack_6b8 = (code *)0x1780b5;
        run_test_tty_cold_19();
LAB_001780b5:
        pcStack_6b8 = (code *)0x1780ba;
        run_test_tty_cold_8();
LAB_001780ba:
        pcStack_6b8 = (code *)0x1780bf;
        run_test_tty_cold_9();
LAB_001780bf:
        pcStack_6b8 = (code *)0x1780c4;
        run_test_tty_cold_10();
LAB_001780c4:
        pcStack_6b8 = (code *)0x1780c9;
        run_test_tty_cold_11();
LAB_001780c9:
        pcStack_6b8 = (code *)0x1780ce;
        run_test_tty_cold_12();
LAB_001780ce:
        pcStack_6b8 = (code *)0x1780d3;
        run_test_tty_cold_13();
LAB_001780d3:
        pcStack_6b8 = (code *)0x1780d8;
        run_test_tty_cold_14();
LAB_001780d8:
        pcStack_6b8 = (code *)0x1780dd;
        run_test_tty_cold_15();
      }
      pcStack_6b8 = run_test_tty_file;
      run_test_tty_cold_16();
      pcStack_dc0 = (code *)0x1780f7;
      pcStack_6b8 = (code *)puVar5;
      iVar1 = uv_loop_init(auStack_a08);
      if (iVar1 == 0) {
        pcStack_dc0 = (code *)0x17810f;
        uVar2 = open64("test/fixtures/empty_file",0);
        if (uVar2 != 0xffffffff) {
          puVar5 = (undefined1 *)(ulong)uVar2;
          pcStack_dc0 = (code *)0x17812f;
          iVar1 = uv_tty_init(auStack_a08,auStack_db0,uVar2,1);
          if (iVar1 != -0x16) goto LAB_0017844f;
          pcStack_dc0 = (code *)0x17813f;
          iVar1 = close(uVar2);
          if (iVar1 == 0) goto LAB_00178147;
          goto LAB_00178454;
        }
LAB_00178147:
        pcStack_dc0 = (code *)0x178157;
        uVar2 = open64("/dev/random",0);
        if (uVar2 != 0xffffffff) {
          puVar5 = (undefined1 *)(ulong)uVar2;
          pcStack_dc0 = (code *)0x178177;
          iVar1 = uv_tty_init(auStack_a08,auStack_db0,uVar2,1);
          if (iVar1 != -0x16) goto LAB_00178459;
          pcStack_dc0 = (code *)0x178187;
          iVar1 = close(uVar2);
          if (iVar1 == 0) goto LAB_0017818f;
          goto LAB_0017845e;
        }
LAB_0017818f:
        pcStack_dc0 = (code *)0x17819f;
        uVar2 = open64("/dev/zero",0);
        if (uVar2 != 0xffffffff) {
          puVar5 = (undefined1 *)(ulong)uVar2;
          pcStack_dc0 = (code *)0x1781bf;
          iVar1 = uv_tty_init(auStack_a08,auStack_db0,uVar2,1);
          if (iVar1 != -0x16) goto LAB_00178463;
          pcStack_dc0 = (code *)0x1781cf;
          iVar1 = close(uVar2);
          if (iVar1 == 0) goto LAB_001781d7;
          goto LAB_00178468;
        }
LAB_001781d7:
        pcStack_dc0 = (code *)0x1781ea;
        uVar2 = open64("/dev/tty",2);
        if (uVar2 != 0xffffffff) {
          puVar5 = (undefined1 *)(ulong)uVar2;
          pcStack_dc0 = (code *)0x17820e;
          iVar1 = uv_tty_init(auStack_a08,auStack_db0,uVar2,1);
          if (iVar1 != 0) goto LAB_0017846d;
          pcStack_dc0 = (code *)0x17821d;
          iVar1 = close(uVar2);
          if (iVar1 != 0) goto LAB_00178472;
          pcStack_dc0 = (code *)0x17822f;
          iVar1 = uv_is_readable(auStack_db0);
          if (iVar1 == 0) goto LAB_00178477;
          pcStack_dc0 = (code *)0x178241;
          iVar1 = uv_is_writable(auStack_db0);
          if (iVar1 == 0) goto LAB_0017847c;
          puVar5 = auStack_db0;
          pcStack_dc0 = (code *)0x178258;
          uv_close(puVar5);
          pcStack_dc0 = (code *)0x178260;
          iVar1 = uv_is_readable(puVar5);
          if (iVar1 != 0) goto LAB_00178486;
          pcStack_dc0 = (code *)0x178272;
          iVar1 = uv_is_writable(auStack_db0);
          if (iVar1 == 0) goto LAB_0017827a;
          goto LAB_00178490;
        }
LAB_0017827a:
        pcStack_dc0 = (code *)0x17828a;
        uVar2 = open64("/dev/tty",0);
        if (uVar2 != 0xffffffff) {
          puVar5 = (undefined1 *)(ulong)uVar2;
          pcStack_dc0 = (code *)0x1782b1;
          iVar1 = uv_tty_init(auStack_a08,auStack_b40,uVar2,1);
          if (iVar1 != 0) goto LAB_00178481;
          pcStack_dc0 = (code *)0x1782c0;
          iVar1 = close(uVar2);
          if (iVar1 != 0) goto LAB_0017848b;
          pcStack_dc0 = (code *)0x1782d5;
          iVar1 = uv_is_readable(auStack_b40);
          if (iVar1 == 0) goto LAB_00178495;
          pcStack_dc0 = (code *)0x1782ea;
          iVar1 = uv_is_writable(auStack_b40);
          if (iVar1 != 0) goto LAB_0017849a;
          puVar5 = auStack_b40;
          pcStack_dc0 = (code *)0x178304;
          uv_close(puVar5,0);
          pcStack_dc0 = (code *)0x17830c;
          iVar1 = uv_is_readable(puVar5);
          if (iVar1 != 0) goto LAB_001784a4;
          pcStack_dc0 = (code *)0x178321;
          iVar1 = uv_is_writable(auStack_b40);
          if (iVar1 == 0) goto LAB_00178329;
          goto LAB_001784ae;
        }
LAB_00178329:
        pcStack_dc0 = (code *)0x17833c;
        uVar2 = open64("/dev/tty",1);
        if (uVar2 == 0xffffffff) {
LAB_001783d8:
          pcStack_dc0 = (code *)0x1783e7;
          iVar1 = uv_run(auStack_a08,0);
          if (iVar1 != 0) goto LAB_00178440;
          pcStack_dc0 = (code *)0x1783f8;
          iVar1 = uv_loop_close(auStack_a08);
          if (iVar1 != 0) goto LAB_00178445;
          pcStack_dc0 = (code *)0x178401;
          puVar5 = (undefined1 *)uv_default_loop();
          pcStack_dc0 = (code *)0x178415;
          uv_walk(puVar5,close_walk_cb,0);
          pcStack_dc0 = (code *)0x17841f;
          uv_run(puVar5,0);
          pcStack_dc0 = (code *)0x178424;
          uVar6 = uv_default_loop();
          pcStack_dc0 = (code *)0x17842c;
          iVar1 = uv_loop_close(uVar6);
          if (iVar1 == 0) {
            return 0;
          }
          goto LAB_0017844a;
        }
        puVar5 = (undefined1 *)(ulong)uVar2;
        pcStack_dc0 = (code *)0x178360;
        iVar1 = uv_tty_init(auStack_a08,auStack_c78,uVar2,0);
        if (iVar1 != 0) goto LAB_0017849f;
        pcStack_dc0 = (code *)0x17836f;
        iVar1 = close(uVar2);
        if (iVar1 != 0) goto LAB_001784a9;
        pcStack_dc0 = (code *)0x178384;
        iVar1 = uv_is_readable(auStack_c78);
        if (iVar1 != 0) goto LAB_001784b3;
        pcStack_dc0 = (code *)0x178399;
        iVar1 = uv_is_writable(auStack_c78);
        if (iVar1 == 0) goto LAB_001784b8;
        puVar5 = auStack_c78;
        pcStack_dc0 = (code *)0x1783b3;
        uv_close(puVar5,0);
        pcStack_dc0 = (code *)0x1783bb;
        iVar1 = uv_is_readable(puVar5);
        if (iVar1 != 0) goto LAB_001784bd;
        pcStack_dc0 = (code *)0x1783d0;
        iVar1 = uv_is_writable(auStack_c78);
        if (iVar1 == 0) goto LAB_001783d8;
      }
      else {
        pcStack_dc0 = (code *)0x178440;
        run_test_tty_file_cold_1();
LAB_00178440:
        pcStack_dc0 = (code *)0x178445;
        run_test_tty_file_cold_26();
LAB_00178445:
        pcStack_dc0 = (code *)0x17844a;
        run_test_tty_file_cold_27();
LAB_0017844a:
        pcStack_dc0 = (code *)0x17844f;
        run_test_tty_file_cold_28();
LAB_0017844f:
        pcStack_dc0 = (code *)0x178454;
        run_test_tty_file_cold_2();
LAB_00178454:
        pcStack_dc0 = (code *)0x178459;
        run_test_tty_file_cold_3();
LAB_00178459:
        pcStack_dc0 = (code *)0x17845e;
        run_test_tty_file_cold_4();
LAB_0017845e:
        pcStack_dc0 = (code *)0x178463;
        run_test_tty_file_cold_5();
LAB_00178463:
        pcStack_dc0 = (code *)0x178468;
        run_test_tty_file_cold_6();
LAB_00178468:
        pcStack_dc0 = (code *)0x17846d;
        run_test_tty_file_cold_7();
LAB_0017846d:
        pcStack_dc0 = (code *)0x178472;
        run_test_tty_file_cold_8();
LAB_00178472:
        pcStack_dc0 = (code *)0x178477;
        run_test_tty_file_cold_9();
LAB_00178477:
        pcStack_dc0 = (code *)0x17847c;
        run_test_tty_file_cold_13();
LAB_0017847c:
        pcStack_dc0 = (code *)0x178481;
        run_test_tty_file_cold_12();
LAB_00178481:
        pcStack_dc0 = (code *)0x178486;
        run_test_tty_file_cold_14();
LAB_00178486:
        pcStack_dc0 = (code *)0x17848b;
        run_test_tty_file_cold_10();
LAB_0017848b:
        pcStack_dc0 = (code *)0x178490;
        run_test_tty_file_cold_15();
LAB_00178490:
        pcStack_dc0 = (code *)0x178495;
        run_test_tty_file_cold_11();
LAB_00178495:
        pcStack_dc0 = (code *)0x17849a;
        run_test_tty_file_cold_19();
LAB_0017849a:
        pcStack_dc0 = (code *)0x17849f;
        run_test_tty_file_cold_16();
LAB_0017849f:
        pcStack_dc0 = (code *)0x1784a4;
        run_test_tty_file_cold_20();
LAB_001784a4:
        pcStack_dc0 = (code *)0x1784a9;
        run_test_tty_file_cold_17();
LAB_001784a9:
        pcStack_dc0 = (code *)0x1784ae;
        run_test_tty_file_cold_21();
LAB_001784ae:
        pcStack_dc0 = (code *)0x1784b3;
        run_test_tty_file_cold_18();
LAB_001784b3:
        pcStack_dc0 = (code *)0x1784b8;
        run_test_tty_file_cold_22();
LAB_001784b8:
        pcStack_dc0 = (code *)0x1784bd;
        run_test_tty_file_cold_25();
LAB_001784bd:
        pcStack_dc0 = (code *)0x1784c2;
        run_test_tty_file_cold_23();
      }
      pcStack_dc0 = run_test_tty_pty;
      run_test_tty_file_cold_24();
      puVar7 = auStack_1118;
      puStack_dc8 = puVar5;
      pcStack_dc0 = (code *)piVar8;
      iVar1 = uv_loop_init(puVar7);
      if (iVar1 == 0) {
        iVar1 = openpty(&uStack_1394,&uStack_1398,0,0,auStack_1390);
        if (iVar1 != 0) {
          run_test_tty_pty_cold_2();
          return 1;
        }
        puVar7 = auStack_1118;
        iVar1 = uv_tty_init(puVar7,auStack_1388,uStack_1398,0);
        if (iVar1 != 0) goto LAB_00178658;
        puVar7 = auStack_1118;
        iVar1 = uv_tty_init(puVar7,auStack_1250,uStack_1394,0);
        if (iVar1 != 0) goto LAB_0017865d;
        puVar7 = auStack_1388;
        iVar1 = uv_is_readable(puVar7);
        if (iVar1 == 0) goto LAB_00178662;
        puVar7 = auStack_1388;
        iVar1 = uv_is_writable(puVar7);
        if (iVar1 == 0) goto LAB_00178667;
        puVar7 = auStack_1250;
        iVar1 = uv_is_readable(puVar7);
        if (iVar1 == 0) goto LAB_0017866c;
        puVar7 = auStack_1250;
        iVar1 = uv_is_writable(puVar7);
        if (iVar1 == 0) goto LAB_00178671;
        if ((bStack_132e & 0x10) != 0) goto LAB_00178676;
        if ((bStack_11f6 & 0x10) == 0) goto LAB_0017867b;
        puVar7 = (undefined1 *)(ulong)uStack_1398;
        iVar1 = close(uStack_1398);
        if (iVar1 != 0) goto LAB_00178680;
        uv_close(auStack_1388,0);
        puVar7 = (undefined1 *)(ulong)uStack_1394;
        iVar1 = close(uStack_1394);
        if (iVar1 != 0) goto LAB_00178685;
        uv_close(auStack_1250,0);
        puVar7 = auStack_1118;
        iVar1 = uv_run(puVar7,0);
        if (iVar1 == 0) {
          uVar6 = uv_default_loop();
          uv_walk(uVar6,close_walk_cb,0);
          uv_run(uVar6,0);
          puVar7 = (undefined1 *)uv_default_loop();
          iVar1 = uv_loop_close(puVar7);
          if (iVar1 == 0) {
            return 0;
          }
          goto LAB_0017868f;
        }
      }
      else {
        run_test_tty_pty_cold_1();
LAB_00178658:
        run_test_tty_pty_cold_3();
LAB_0017865d:
        run_test_tty_pty_cold_4();
LAB_00178662:
        run_test_tty_pty_cold_14();
LAB_00178667:
        run_test_tty_pty_cold_13();
LAB_0017866c:
        run_test_tty_pty_cold_12();
LAB_00178671:
        run_test_tty_pty_cold_11();
LAB_00178676:
        run_test_tty_pty_cold_5();
LAB_0017867b:
        run_test_tty_pty_cold_10();
LAB_00178680:
        run_test_tty_pty_cold_6();
LAB_00178685:
        run_test_tty_pty_cold_7();
      }
      run_test_tty_pty_cold_8();
LAB_0017868f:
      run_test_tty_pty_cold_9();
      iVar1 = uv_is_closing();
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = uv_close(puVar7,0);
      return iVar1;
    }
  }
LAB_0017806e:
  pcStack_6b8 = (code *)0x178073;
  run_test_tty_cold_21();
  piVar8 = (int *)0x1;
LAB_00178079:
  return (int)piVar8;
}

Assistant:

TEST_IMPL(tmpdir) {
  char tmpdir[PATHMAX];
  size_t len;
  char last;
  int r;

  /* Test the normal case */
  len = sizeof tmpdir;
  tmpdir[0] = '\0';

  ASSERT(strlen(tmpdir) == 0);
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT(r == 0);
  ASSERT(strlen(tmpdir) == len);
  ASSERT(len > 0);
  ASSERT(tmpdir[len] == '\0');

  if (len > 1) {
    last = tmpdir[len - 1];
#ifdef _WIN32
    ASSERT(last != '\\');
#else
    ASSERT(last != '/');
#endif
  }

  /* Test the case where the buffer is too small */
  len = SMALLPATH;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(len > SMALLPATH);

  /* Test invalid inputs */
  r = uv_os_tmpdir(NULL, &len);
  ASSERT(r == UV_EINVAL);
  r = uv_os_tmpdir(tmpdir, NULL);
  ASSERT(r == UV_EINVAL);
  len = 0;
  r = uv_os_tmpdir(tmpdir, &len);
  ASSERT(r == UV_EINVAL);

#ifdef _WIN32
  const char *name = "TMP";
  char tmpdir_win[] = "C:\\xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx";
  r = uv_os_setenv(name, tmpdir_win);
  ASSERT(r == 0);
  char tmpdirx[PATHMAX];
  size_t lenx = sizeof tmpdirx;
  r = uv_os_tmpdir(tmpdirx, &lenx);
  ASSERT(r == 0);
#endif

  return 0;
}